

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitSVTest_single_word_trailing_delim_Test<char32_t>::SplitSVTest_single_word_trailing_delim_Test
          (SplitSVTest_single_word_trailing_delim_Test<char32_t> *this)

{
  SplitSVTest_single_word_trailing_delim_Test<char32_t> *this_local;
  
  SplitSVTest<char32_t>::SplitSVTest(&this->super_SplitSVTest<char32_t>);
  *(undefined ***)&this->super_SplitSVTest<char32_t> =
       &PTR__SplitSVTest_single_word_trailing_delim_Test_00819ca8;
  return;
}

Assistant:

TYPED_TEST(SplitSVTest, single_word_trailing_delim) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 2);
	EXPECT_EQ(split_result[0].size(), 8);
	EXPECT_EQ(split_result[1].size(), 0);
}